

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_scale_mode(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *in_RSI;
  long in_RDI;
  int res;
  AV1EncoderConfig *oxcf;
  aom_scaling_mode_t *mode;
  aom_codec_alg_priv_t_conflict *local_48;
  AV1_COMP *oxcf_00;
  undefined4 in_stack_ffffffffffffffd4;
  aom_codec_err_t local_4;
  
  uVar1 = *(uint *)in_RSI->parallel_cpi;
  if (uVar1 < 0x29) {
    oxcf_00 = (AV1_COMP *)
              ((long)((in_RSI->parallel_cpi[2]->enc_quant_dequant_params).quants.y_quant + -1) +
              (long)(int)uVar1);
    *(uint *)in_RSI->parallel_cpi = uVar1 + 8;
  }
  else {
    oxcf_00 = in_RSI->parallel_cpi[1];
    in_RSI->parallel_cpi[1] = (AV1_COMP *)&oxcf_00->field_0x8;
  }
  if (((InputCfg *)&oxcf_00->ppi)->init_framerate == 0.0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    if (*(int *)(*(long *)(in_RDI + 0xb50) + 0x178) == 0) {
      local_48 = (aom_codec_alg_priv_t_conflict *)(in_RDI + 0x6d0);
    }
    else {
      local_48 = (aom_codec_alg_priv_t_conflict *)
                 (*(long *)(*(long *)(in_RDI + 0xb50) + 0x160) + 0x42320);
    }
    iVar2 = av1_set_internal_size
                      ((AV1EncoderConfig *)local_48,
                       (ResizePendingParams *)CONCAT44(in_stack_ffffffffffffffd4,uVar1),
                       (AOM_SCALING_MODE)((ulong)in_RSI >> 0x20),(AOM_SCALING_MODE)in_RSI);
    if (iVar2 == 0) {
      if (*(int *)(*(long *)(in_RDI + 0xb50) + 0x178) == 0) {
        local_4 = update_encoder_cfg(local_48);
      }
      else {
        av1_check_fpmt_config(in_RSI,(AV1EncoderConfig *)oxcf_00);
        local_4 = AOM_CODEC_OK;
      }
    }
    else {
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_scale_mode(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_scaling_mode_t *const mode = va_arg(args, aom_scaling_mode_t *);

  if (mode) {
    AV1EncoderConfig *const oxcf =
        ctx->ppi->seq_params_locked ? &ctx->ppi->cpi->oxcf : &ctx->oxcf;
    const int res =
        av1_set_internal_size(oxcf, &ctx->ppi->cpi->resize_pending_params,
                              mode->h_scaling_mode, mode->v_scaling_mode);
    if (res == 0) {
      // update_encoder_cfg() is somewhat costly and this control may be called
      // multiple times, so update_encoder_cfg() is only called to ensure frame
      // and superblock sizes are updated before they're fixed by the first
      // encode call.
      if (ctx->ppi->seq_params_locked) {
        av1_check_fpmt_config(ctx->ppi, &ctx->ppi->cpi->oxcf);
        return AOM_CODEC_OK;
      }
      return update_encoder_cfg(ctx);
    }
    return AOM_CODEC_INVALID_PARAM;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}